

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1535.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long protocol;
  long local_30;
  
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                  ,0x22,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                  ,0x24);
    iVar1 = 0x7c;
    goto LAB_00102358;
  }
  iVar1 = curl_easy_getinfo(lVar4,0x200030,&local_30);
  uVar7 = _stderr;
  if (iVar1 == 0) {
    if (local_30 != 0) {
      lVar5 = 0;
      uVar7 = 0x31;
LAB_0010234c:
      curl_mfprintf(_stderr,"%s:%d protocol init failed; expected 0 but is %ld\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                    ,uVar7);
LAB_00102353:
      iVar1 = 2;
      goto LAB_00102358;
    }
    iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar7 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_perform(lVar4);
      uVar7 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_getinfo(lVar4,0x200030,&local_30);
        uVar7 = _stderr;
        if (iVar1 == 0) {
          if (local_30 != 1) {
            lVar5 = 0;
            curl_mfprintf(_stderr,
                          "%s:%d protocol of http resource is incorrect; expected %d but is %ld\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                          ,0x4b,1);
            iVar1 = 0x16;
            goto LAB_00102358;
          }
          lVar5 = curl_easy_duphandle(lVar4);
          if (lVar5 == 0) {
            lVar5 = 0;
            curl_mfprintf(_stderr,"%s:%d curl_easy_duphandle() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                          ,0x56);
            goto LAB_00102353;
          }
          iVar1 = curl_easy_getinfo(lVar5,0x200030,&local_30);
          uVar7 = _stderr;
          if (iVar1 == 0) {
            if (local_30 == 0) {
              curl_easy_reset(lVar4);
              iVar1 = 0;
              iVar2 = curl_easy_getinfo(lVar4,0x200030,&local_30);
              uVar7 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar7,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                              ,0x71,iVar2,uVar3);
                iVar1 = iVar2;
                goto LAB_00102358;
              }
              if (local_30 == 0) goto LAB_00102358;
              uVar7 = 0x76;
            }
            else {
              uVar7 = 99;
            }
            goto LAB_0010234c;
          }
          uVar3 = curl_easy_strerror(iVar1);
          pcVar8 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
          uVar6 = 0x5e;
        }
        else {
          uVar3 = curl_easy_strerror(iVar1);
          pcVar8 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
          lVar5 = 0;
          uVar6 = 0x45;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar8 = "%s:%d curl_easy_perform() failed with code %d (%s)\n";
        lVar5 = 0;
        uVar6 = 0x3b;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar5 = 0;
      uVar6 = 0x36;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    pcVar8 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
    lVar5 = 0;
    uVar6 = 0x2c;
  }
  curl_mfprintf(uVar7,pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1535.c"
                ,uVar6,iVar1,uVar3);
LAB_00102358:
  curl_easy_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl, *dupe = NULL;
  long protocol;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  /* Test that protocol is properly initialized on curl_easy_init.
  */

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != 0) {
    fprintf(stderr, "%s:%d protocol init failed; expected 0 but is %ld\n",
            __FILE__, __LINE__, protocol);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  easy_setopt(curl, CURLOPT_URL, URL);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  /* Test that a protocol is properly set after receiving an HTTP resource.
  */

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != CURLPROTO_HTTP) {
    fprintf(stderr, "%s:%d protocol of http resource is incorrect; "
            "expected %d but is %ld\n",
            __FILE__, __LINE__, CURLPROTO_HTTP, protocol);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test that a protocol is properly initialized on curl_easy_duphandle.
  */

  dupe = curl_easy_duphandle(curl);
  if(!dupe) {
    fprintf(stderr, "%s:%d curl_easy_duphandle() failed\n",
            __FILE__, __LINE__);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

  res = curl_easy_getinfo(dupe, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != 0) {
    fprintf(stderr, "%s:%d protocol init failed; expected 0 but is %ld\n",
            __FILE__, __LINE__, protocol);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }


  /* Test that a protocol is properly initialized on curl_easy_reset.
  */

  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(protocol != 0) {
    fprintf(stderr, "%s:%d protocol init failed; expected 0 but is %ld\n",
            __FILE__, __LINE__, protocol);
    res = CURLE_FAILED_INIT;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_easy_cleanup(dupe);
  curl_global_cleanup();
  return res;
}